

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createPerQuads<deqp::gls::GLValue::Half>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,Half min,
                 Half max)

{
  Half HVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  deRandom rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar6 = componentCount * 2;
  if (stride != 0) {
    iVar6 = stride;
  }
  uVar7 = 0;
  iVar2 = iVar6 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar2 = 0;
  }
  pcVar4 = (char *)operator_new__((long)(iVar2 * count));
  if (componentCount < 1) {
    componentCount = 0;
  }
  uVar8 = (ulong)(uint)count;
  if (count < 1) {
    uVar8 = uVar7;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    iVar3 = iVar2 * (int)uVar7;
    for (uVar9 = 0; (uint)(componentCount * 2) != uVar9; uVar9 = uVar9 + 2) {
      HVar1 = getRandom<deqp::gls::GLValue::Half>(&local_40,min,max);
      lVar5 = (long)(int)uVar9;
      *(deFloat16 *)(pcVar4 + lVar5 + iVar3) = HVar1.m_value;
      *(deFloat16 *)(pcVar4 + lVar5 + (long)iVar6 + (long)iVar3) = HVar1.m_value;
      *(deFloat16 *)(pcVar4 + lVar5 + (long)(iVar6 * 2) + (long)iVar3) = HVar1.m_value;
      *(deFloat16 *)(pcVar4 + lVar5 + (long)(iVar6 * 3) + (long)iVar3) = HVar1.m_value;
      *(deFloat16 *)(pcVar4 + lVar5 + (long)(iVar6 * 4) + (long)iVar3) = HVar1.m_value;
      *(deFloat16 *)(pcVar4 + lVar5 + (long)(iVar6 * 5) + (long)iVar3) = HVar1.m_value;
    }
  }
  return pcVar4;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}